

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_picnic_test.cpp
# Opt level: O2

void modified_public_keycase::test_method<picnic_params_t_const&>(anon_enum_32 *parameters)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  context_frame context_frame_1970;
  const_string local_2f0;
  const_string local_2e0;
  const_string local_2d0;
  const_string local_2c0;
  const_string local_2b0;
  anon_enum_32 *local_2a0;
  undefined1 local_298 [16];
  modified_public_keycase *pmStack_288;
  char *pcStack_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 uStack_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  _Alloc_hider _Stack_120;
  size_type sStack_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_110;
  const_string local_f8;
  const_string local_e8;
  const_string local_d8;
  const_string local_c8;
  const_string local_b8;
  modified_public_keycase t;
  undefined **local_88;
  undefined1 local_80;
  undefined1 *local_78;
  char *local_70;
  undefined **local_68;
  undefined1 local_60;
  undefined ***local_58;
  char *local_50;
  undefined **local_48;
  undefined1 local_40;
  undefined ***local_38;
  char *local_30;
  
  local_58 = &local_88;
  local_80 = 0;
  local_88 = &PTR__lazy_ostream_00182750;
  local_40 = 0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = "";
  local_38 = &local_68;
  local_60 = 0;
  local_68 = &PTR__lazy_ostream_001829d8;
  local_50 = "parameters";
  local_48 = &PTR__lazy_ostream_00182998;
  pmStack_288 = &t;
  local_30 = " = ";
  _t = &PTR__lazy_ostream_00182958;
  local_298._8_8_ = local_298._8_8_ & 0xffffffffffffff00;
  local_298._0_8_ = &PTR__lazy_ostream_00182918;
  pcStack_280 = "; ";
  local_2a0 = parameters;
  boost::test_tools::tt_detail::context_frame::context_frame
            (&context_frame_1970,(lazy_ostream *)local_298);
  bVar2 = boost::test_tools::tt_detail::context_frame::operator_cast_to_bool(&context_frame_1970);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  if (bVar2) {
    local_2b0.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    sStack_118 = 0;
    aStack_110._M_allocated_capacity = 0;
    aStack_110._8_8_ = 0;
    local_2b0.m_end = "";
    uStack_158 = 0;
    uStack_150 = 0;
    uStack_148 = 0;
    local_140 = 0;
    uStack_138 = 0;
    uStack_130 = 0;
    uStack_128 = 0;
    _Stack_120._M_p = (pointer)0x0;
    local_198 = 0;
    uStack_190 = 0;
    uStack_188 = 0;
    uStack_180 = 0;
    uStack_178 = 0;
    uStack_170 = 0;
    uStack_168 = 0;
    uStack_160 = 0;
    local_1d8 = 0;
    uStack_1d0 = 0;
    uStack_1c8 = 0;
    uStack_1c0 = 0;
    uStack_1b8 = 0;
    uStack_1b0 = 0;
    uStack_1a8 = 0;
    uStack_1a0 = 0;
    local_218 = 0;
    uStack_210 = 0;
    uStack_208 = 0;
    uStack_200 = 0;
    uStack_1f8 = 0;
    uStack_1f0 = 0;
    uStack_1e8 = 0;
    uStack_1e0 = 0;
    local_258 = 0;
    uStack_250 = 0;
    uStack_248 = 0;
    uStack_240 = 0;
    uStack_238 = 0;
    uStack_230 = 0;
    uStack_228 = 0;
    uStack_220 = 0;
    local_298._0_8_ = (_func_int **)0x0;
    local_298._8_8_ = 0;
    pmStack_288 = (modified_public_keycase *)0x0;
    pcStack_280 = (char *)0x0;
    uStack_278 = 0;
    uStack_270 = 0;
    uStack_268 = 0;
    uStack_260 = 0;
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
              ((basic_wrap_stringstream<char> *)local_298);
    std::operator<<((ostream *)local_298,'\"');
    std::operator<<((ostream *)local_298,"modified_public_key");
    std::operator<<((ostream *)local_298,"\" fixture ctor");
    pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_
                       ((basic_wrap_stringstream<char> *)local_298);
    local_b8.m_begin = (pbVar3->_M_dataplus)._M_p;
    local_b8.m_end = local_b8.m_begin + pbVar3->_M_string_length;
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2b0,0xc5,&local_b8);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
              ((basic_wrap_stringstream<char> *)local_298);
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    local_2c0.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_2c0.m_end = "";
    sStack_118 = 0;
    aStack_110._M_allocated_capacity = 0;
    aStack_110._8_8_ = 0;
    uStack_158 = 0;
    uStack_150 = 0;
    uStack_148 = 0;
    local_140 = 0;
    uStack_138 = 0;
    uStack_130 = 0;
    uStack_128 = 0;
    _Stack_120._M_p = (pointer)0x0;
    local_198 = 0;
    uStack_190 = 0;
    uStack_188 = 0;
    uStack_180 = 0;
    uStack_178 = 0;
    uStack_170 = 0;
    uStack_168 = 0;
    uStack_160 = 0;
    local_1d8 = 0;
    uStack_1d0 = 0;
    uStack_1c8 = 0;
    uStack_1c0 = 0;
    uStack_1b8 = 0;
    uStack_1b0 = 0;
    uStack_1a8 = 0;
    uStack_1a0 = 0;
    local_218 = 0;
    uStack_210 = 0;
    uStack_208 = 0;
    uStack_200 = 0;
    uStack_1f8 = 0;
    uStack_1f0 = 0;
    uStack_1e8 = 0;
    uStack_1e0 = 0;
    local_258 = 0;
    uStack_250 = 0;
    uStack_248 = 0;
    uStack_240 = 0;
    uStack_238 = 0;
    uStack_230 = 0;
    uStack_228 = 0;
    uStack_220 = 0;
    local_298._0_8_ = (_func_int **)0x0;
    local_298._8_8_ = 0;
    pmStack_288 = (modified_public_keycase *)0x0;
    pcStack_280 = (char *)0x0;
    uStack_278 = 0;
    uStack_270 = 0;
    uStack_268 = 0;
    uStack_260 = 0;
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
              ((basic_wrap_stringstream<char> *)local_298);
    std::operator<<((ostream *)local_298,'\"');
    std::operator<<((ostream *)local_298,"modified_public_key");
    std::operator<<((ostream *)local_298,"\" fixture setup");
    pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_
                       ((basic_wrap_stringstream<char> *)local_298);
    local_c8.m_begin = (pbVar3->_M_dataplus)._M_p;
    local_c8.m_end = local_c8.m_begin + pbVar3->_M_string_length;
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2c0,0xc5,&local_c8);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
              ((basic_wrap_stringstream<char> *)local_298);
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    local_2d0.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_2d0.m_end = "";
    sStack_118 = 0;
    aStack_110._M_allocated_capacity = 0;
    aStack_110._8_8_ = 0;
    uStack_158 = 0;
    uStack_150 = 0;
    uStack_148 = 0;
    local_140 = 0;
    uStack_138 = 0;
    uStack_130 = 0;
    uStack_128 = 0;
    _Stack_120._M_p = (pointer)0x0;
    local_198 = 0;
    uStack_190 = 0;
    uStack_188 = 0;
    uStack_180 = 0;
    uStack_178 = 0;
    uStack_170 = 0;
    uStack_168 = 0;
    uStack_160 = 0;
    local_1d8 = 0;
    uStack_1d0 = 0;
    uStack_1c8 = 0;
    uStack_1c0 = 0;
    uStack_1b8 = 0;
    uStack_1b0 = 0;
    uStack_1a8 = 0;
    uStack_1a0 = 0;
    local_218 = 0;
    uStack_210 = 0;
    uStack_208 = 0;
    uStack_200 = 0;
    uStack_1f8 = 0;
    uStack_1f0 = 0;
    uStack_1e8 = 0;
    uStack_1e0 = 0;
    local_258 = 0;
    uStack_250 = 0;
    uStack_248 = 0;
    uStack_240 = 0;
    uStack_238 = 0;
    uStack_230 = 0;
    uStack_228 = 0;
    uStack_220 = 0;
    local_298._0_8_ = (_func_int **)0x0;
    local_298._8_8_ = 0;
    pmStack_288 = (modified_public_keycase *)0x0;
    pcStack_280 = (char *)0x0;
    uStack_278 = 0;
    uStack_270 = 0;
    uStack_268 = 0;
    uStack_260 = 0;
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
              ((basic_wrap_stringstream<char> *)local_298);
    std::operator<<((ostream *)local_298,'\"');
    std::operator<<((ostream *)local_298,"modified_public_key");
    std::operator<<((ostream *)local_298,"\" test entry");
    pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_
                       ((basic_wrap_stringstream<char> *)local_298);
    local_d8.m_begin = (pbVar3->_M_dataplus)._M_p;
    local_d8.m_end = local_d8.m_begin + pbVar3->_M_string_length;
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2d0,0xc5,&local_d8);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
              ((basic_wrap_stringstream<char> *)local_298);
    _impl<picnic_params_t>(&t,parameters);
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    local_2e0.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_2e0.m_end = "";
    sStack_118 = 0;
    aStack_110._M_allocated_capacity = 0;
    aStack_110._8_8_ = 0;
    uStack_158 = 0;
    uStack_150 = 0;
    uStack_148 = 0;
    local_140 = 0;
    uStack_138 = 0;
    uStack_130 = 0;
    uStack_128 = 0;
    _Stack_120._M_p = (pointer)0x0;
    local_198 = 0;
    uStack_190 = 0;
    uStack_188 = 0;
    uStack_180 = 0;
    uStack_178 = 0;
    uStack_170 = 0;
    uStack_168 = 0;
    uStack_160 = 0;
    local_1d8 = 0;
    uStack_1d0 = 0;
    uStack_1c8 = 0;
    uStack_1c0 = 0;
    uStack_1b8 = 0;
    uStack_1b0 = 0;
    uStack_1a8 = 0;
    uStack_1a0 = 0;
    local_218 = 0;
    uStack_210 = 0;
    uStack_208 = 0;
    uStack_200 = 0;
    uStack_1f8 = 0;
    uStack_1f0 = 0;
    uStack_1e8 = 0;
    uStack_1e0 = 0;
    local_258 = 0;
    uStack_250 = 0;
    uStack_248 = 0;
    uStack_240 = 0;
    uStack_238 = 0;
    uStack_230 = 0;
    uStack_228 = 0;
    uStack_220 = 0;
    local_298._0_8_ = (_func_int **)0x0;
    local_298._8_8_ = 0;
    pmStack_288 = (modified_public_keycase *)0x0;
    pcStack_280 = (char *)0x0;
    uStack_278 = 0;
    uStack_270 = 0;
    uStack_268 = 0;
    uStack_260 = 0;
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
              ((basic_wrap_stringstream<char> *)local_298);
    std::operator<<((ostream *)local_298,'\"');
    std::operator<<((ostream *)local_298,"modified_public_key");
    std::operator<<((ostream *)local_298,"\" fixture teardown");
    pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_
                       ((basic_wrap_stringstream<char> *)local_298);
    local_e8.m_begin = (pbVar3->_M_dataplus)._M_p;
    local_e8.m_end = local_e8.m_begin + pbVar3->_M_string_length;
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2e0,0xc5,&local_e8);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
              ((basic_wrap_stringstream<char> *)local_298);
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    local_2f0.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_2f0.m_end = "";
    sStack_118 = 0;
    aStack_110._M_allocated_capacity = 0;
    aStack_110._8_8_ = 0;
    uStack_158 = 0;
    uStack_150 = 0;
    uStack_148 = 0;
    local_140 = 0;
    uStack_138 = 0;
    uStack_130 = 0;
    uStack_128 = 0;
    _Stack_120._M_p = (pointer)0x0;
    local_198 = 0;
    uStack_190 = 0;
    uStack_188 = 0;
    uStack_180 = 0;
    uStack_178 = 0;
    uStack_170 = 0;
    uStack_168 = 0;
    uStack_160 = 0;
    local_1d8 = 0;
    uStack_1d0 = 0;
    uStack_1c8 = 0;
    uStack_1c0 = 0;
    uStack_1b8 = 0;
    uStack_1b0 = 0;
    uStack_1a8 = 0;
    uStack_1a0 = 0;
    local_218 = 0;
    uStack_210 = 0;
    uStack_208 = 0;
    uStack_200 = 0;
    uStack_1f8 = 0;
    uStack_1f0 = 0;
    uStack_1e8 = 0;
    uStack_1e0 = 0;
    local_258 = 0;
    uStack_250 = 0;
    uStack_248 = 0;
    uStack_240 = 0;
    uStack_238 = 0;
    uStack_230 = 0;
    uStack_228 = 0;
    uStack_220 = 0;
    local_298._0_8_ = (_func_int **)0x0;
    local_298._8_8_ = 0;
    pmStack_288 = (modified_public_keycase *)0x0;
    pcStack_280 = (char *)0x0;
    uStack_278 = 0;
    uStack_270 = 0;
    uStack_268 = 0;
    uStack_260 = 0;
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
              ((basic_wrap_stringstream<char> *)local_298);
    std::operator<<((ostream *)local_298,'\"');
    std::operator<<((ostream *)local_298,"modified_public_key");
    std::operator<<((ostream *)local_298,"\" fixture dtor");
    pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_
                       ((basic_wrap_stringstream<char> *)local_298);
    local_f8.m_begin = (pbVar3->_M_dataplus)._M_p;
    local_f8.m_end = local_f8.m_begin + pbVar3->_M_string_length;
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2f0,0xc5,&local_f8);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
              ((basic_wrap_stringstream<char> *)local_298);
  }
  boost::test_tools::tt_detail::context_frame::~context_frame(&context_frame_1970);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(modified_public_key, all_supported_parameters(), parameters) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(parameters)) {
    const size_t max_signature_size = picnic_signature_size(parameters);
    BOOST_TEST(max_signature_size);

    picnic_publickey_t pk;
    picnic_privatekey_t sk;
    BOOST_TEST(!picnic_keygen(parameters, &pk, &sk));

    std::vector<uint8_t> signature, message;
    signature.resize(max_signature_size);

    const size_t message_size = message_inc;
    message.resize(message_size);
    // fill message with some data
    randomize_container(message);

    for (size_t offset = 1; offset != 15; ++offset) {
      sk.data[picnic_get_private_key_size(parameters) - offset] ^= 0xff;
    }

    size_t signature_len = max_signature_size;
    BOOST_TEST(picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len));
  }
}